

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynVariableDefinitions * ParseVariableDefinitions(ParseContext *ctx,bool classMembers)

{
  LexemeType LVar1;
  Lexeme *begin;
  Lexeme *pLVar2;
  int iVar3;
  SynAlign *pSVar4;
  SynBase *pSVar5;
  SynVariableDefinition *pSVar6;
  undefined4 extraout_var;
  char *pcVar7;
  SynVariableDefinitions *unaff_R13;
  IntrusiveList<SynVariableDefinition> definitions;
  IntrusiveList<SynVariableDefinition> local_58;
  SynVariableDefinition *local_48;
  SynVariableDefinition *pSStack_40;
  
  begin = ctx->currentLexeme;
  pSVar4 = ParseAlign(ctx);
  pSVar5 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar5 == (SynBase *)0x0) goto LAB_0011610e;
  local_58.head = (SynVariableDefinition *)0x0;
  local_58.tail = (SynVariableDefinition *)0x0;
  pSVar6 = ParseVariableDefinition(ctx);
  if (pSVar6 == (SynVariableDefinition *)0x0) {
    if (pSVar4 != (SynAlign *)0x0) {
      anon_unknown.dwarf_1613e::Report
                (ctx,ctx->currentLexeme,
                 "ERROR: variable or class definition is expected after alignment specifier");
    }
    ctx->currentLexeme = begin;
    unaff_R13 = (SynVariableDefinitions *)0x0;
    goto LAB_0011610e;
  }
  IntrusiveList<SynVariableDefinition>::push_back(&local_58,pSVar6);
  pLVar2 = ctx->currentLexeme;
  LVar1 = pLVar2->type;
  while (LVar1 == lex_comma) {
    ctx->currentLexeme = pLVar2 + 1;
    pSVar6 = ParseVariableDefinition(ctx);
    if (pSVar6 == (SynVariableDefinition *)0x0) {
      pcVar7 = "ERROR: next variable definition excepted after \',\'";
      if (classMembers) {
        pcVar7 = "ERROR: member name expected after \',\'";
      }
      anon_unknown.dwarf_1613e::Report(ctx,ctx->currentLexeme,pcVar7);
      break;
    }
    IntrusiveList<SynVariableDefinition>::push_back(&local_58,pSVar6);
    pLVar2 = ctx->currentLexeme;
    LVar1 = pLVar2->type;
  }
  if (classMembers) {
    pcVar7 = "ERROR: \';\' not found after class member list";
LAB_0011607f:
    anon_unknown.dwarf_1613e::CheckConsume(ctx,lex_semicolon,pcVar7);
  }
  else {
    if (ctx->currentLexeme->type != lex_semicolon) {
      if (ctx->currentLexeme->type == lex_obracket) {
        pcVar7 = "ERROR: array size must be specified after type name";
      }
      else {
        pcVar7 = "ERROR: \';\' not found after variable definition";
      }
      goto LAB_0011607f;
    }
    ctx->currentLexeme = ctx->currentLexeme + 1;
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  unaff_R13 = (SynVariableDefinitions *)CONCAT44(extraout_var,iVar3);
  if (ctx->currentLexeme <= ctx->firstLexeme) {
    __assert_fail("currentLexeme > firstLexeme",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0x19c,"Lexeme *ParseContext::Previous()");
  }
  local_48 = local_58.head;
  pSStack_40 = local_58.tail;
  SynBase::SynBase((SynBase *)unaff_R13,0x34,begin,ctx->currentLexeme + -1);
  (unaff_R13->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00228d18;
  unaff_R13->align = pSVar4;
  unaff_R13->type = pSVar5;
  (unaff_R13->definitions).head = local_48;
  (unaff_R13->definitions).tail = pSStack_40;
LAB_0011610e:
  if (pSVar5 == (SynBase *)0x0) {
    ctx->currentLexeme = begin;
    unaff_R13 = (SynVariableDefinitions *)0x0;
  }
  return unaff_R13;
}

Assistant:

SynVariableDefinitions* ParseVariableDefinitions(ParseContext &ctx, bool classMembers)
{
	Lexeme *start = ctx.currentLexeme;

	SynAlign *align = ParseAlign(ctx);

	if(SynBase *type = ParseType(ctx))
	{
		IntrusiveList<SynVariableDefinition> definitions;

		SynVariableDefinition *definition = ParseVariableDefinition(ctx);

		if(!definition)
		{
			if(align)
				Report(ctx, ctx.Current(), "ERROR: variable or class definition is expected after alignment specifier");

			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		definitions.push_back(definition);

		while(ctx.Consume(lex_comma))
		{
			definition = ParseVariableDefinition(ctx);

			if(!definition)
			{
				if(classMembers)
					Report(ctx, ctx.Current(), "ERROR: member name expected after ','");
				else
					Report(ctx, ctx.Current(), "ERROR: next variable definition excepted after ','");

				break;
			}

			definitions.push_back(definition);
		}

		if(classMembers)
		{
			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after class member list");
		}
		else if(!ctx.Consume(lex_semicolon))
		{
			if(ctx.Peek() == lex_obracket)
				CheckConsume(ctx, lex_semicolon, "ERROR: array size must be specified after type name");
			else
				CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after variable definition");
		}

		return new (ctx.get<SynVariableDefinitions>()) SynVariableDefinitions(start, ctx.Previous(), align, type, definitions);
	}
	
	// Backtrack
	ctx.currentLexeme = start;

	return NULL;
}